

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeak_Test::testBody(TEST_MemoryLeakDetectorTest_OneLeak_Test *this)

{
  int iVar1;
  char *pcVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_48 [2];
  undefined1 local_28 [8];
  SimpleString output;
  char *mem;
  TEST_MemoryLeakDetectorTest_OneLeak_Test *this_local;
  
  output.bufferSize_ =
       (size_t)MemoryLeakDetector::allocMemory
                         ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                          &((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).
                           testAllocator)->super_TestMemoryAllocator,3,false);
  MemoryLeakDetector::stopChecking
            ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector);
  pcVar2 = MemoryLeakDetector::report
                     ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector,
                      mem_leak_period_checking);
  SimpleString::SimpleString((SimpleString *)local_28,pcVar2);
  pUVar3 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"Memory leak(s) found",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x89);
  pUVar3 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"size: 3",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8a);
  pUVar3 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"alloc",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8b);
  pUVar3 = UtestShell::getCurrent();
  StringFromFormat((char *)local_48,"%p",output.bufferSize_);
  pcVar2 = SimpleString::asCharString(local_48);
  pcVar4 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,pcVar2,pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8c);
  SimpleString::~SimpleString(local_48);
  pUVar3 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)local_28);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"Total number of leaks",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8d);
  (*PlatformSpecificFree)((void *)output.bufferSize_);
  pUVar3 = UtestShell::getCurrent();
  iVar1 = *(int *)&(((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->
                   super_TestMemoryAllocator).field_0x24;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,1,(long)iVar1,"LONGS_EQUAL(1, testAllocator->alloc_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x8f,pTVar5);
  pUVar3 = UtestShell::getCurrent();
  iVar1 = ((this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator)->free_called;
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar1,"LONGS_EQUAL(0, testAllocator->free_called) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x90,pTVar5);
  SimpleString::~SimpleString((SimpleString *)local_28);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 3);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    STRCMP_CONTAINS("Memory leak(s) found", output.asCharString());
    STRCMP_CONTAINS("size: 3", output.asCharString());
    STRCMP_CONTAINS("alloc", output.asCharString());
    STRCMP_CONTAINS(StringFromFormat("%p", (void*) mem).asCharString(), output.asCharString());
    STRCMP_CONTAINS("Total number of leaks", output.asCharString());
    PlatformSpecificFree(mem);
    LONGS_EQUAL(1, testAllocator->alloc_called);
    LONGS_EQUAL(0, testAllocator->free_called);
}